

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FindProgramPath
               (char *argv0,string *pathOut,string *errorMsg,char *exeName,char *buildDir,
               char *installPrefix)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pbVar4;
  char *local_2b0;
  string local_2a0 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  iterator i;
  ostringstream msg;
  allocator local_e9;
  string local_e8 [8];
  string intdir;
  string local_b0;
  allocator local_79;
  undefined1 local_78 [8];
  string self;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failures;
  char *installPrefix_local;
  char *buildDir_local;
  char *exeName_local;
  string *errorMsg_local;
  string *pathOut_local;
  char *argv0_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&self.field_2 + 8));
  local_2b0 = argv0;
  if (argv0 == (char *)0x0) {
    local_2b0 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,local_2b0,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&self.field_2 + 8),(value_type *)local_78);
  ConvertToUnixSlashes((string *)local_78);
  intdir.field_2._8_8_ = 0;
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&intdir.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this);
  FindProgram(&local_b0,(string *)local_78,this,false);
  std::__cxx11::string::operator=((string *)local_78,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&intdir.field_2 + 8));
  bVar1 = FileExists((string *)local_78);
  if ((!bVar1) && (buildDir != (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,".",&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::operator=((string *)local_78,buildDir);
    std::__cxx11::string::operator+=((string *)local_78,"/bin/");
    std::__cxx11::string::operator+=((string *)local_78,local_e8);
    std::__cxx11::string::operator+=((string *)local_78,"/");
    std::__cxx11::string::operator+=((string *)local_78,exeName);
    pcVar2 = GetExecutableExtension();
    std::__cxx11::string::operator+=((string *)local_78,pcVar2);
    std::__cxx11::string::~string(local_e8);
  }
  if ((installPrefix != (char *)0x0) && (bVar1 = FileExists((string *)local_78), !bVar1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&self.field_2 + 8),(value_type *)local_78);
    std::__cxx11::string::operator=((string *)local_78,installPrefix);
    std::__cxx11::string::operator+=((string *)local_78,"/bin/");
    std::__cxx11::string::operator+=((string *)local_78,exeName);
  }
  bVar1 = FileExists((string *)local_78);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)pathOut,(string *)local_78);
    argv0_local._7_1_ = true;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&self.field_2 + 8),(value_type *)local_78);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
    std::operator<<((ostream *)&i,"Can not find the command line program ");
    if (exeName != (char *)0x0) {
      std::operator<<((ostream *)&i,exeName);
    }
    std::operator<<((ostream *)&i,"\n");
    if (argv0 != (char *)0x0) {
      poVar3 = std::operator<<((ostream *)&i,"  argv[0] = \"");
      poVar3 = std::operator<<(poVar3,argv0);
      std::operator<<(poVar3,"\"\n");
    }
    std::operator<<((ostream *)&i,"  Attempted paths:\n");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_270);
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&self.field_2 + 8));
    local_270._M_current = local_278;
    while( true ) {
      local_280._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&self.field_2 + 8));
      bVar1 = __gnu_cxx::operator!=(&local_270,&local_280);
      if (!bVar1) break;
      poVar3 = std::operator<<((ostream *)&i,"    \"");
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_270);
      poVar3 = std::operator<<(poVar3,(string *)pbVar4);
      std::operator<<(poVar3,"\"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_270);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)errorMsg,local_2a0);
    std::__cxx11::string::~string(local_2a0);
    argv0_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  }
  std::__cxx11::string::~string((string *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&self.field_2 + 8));
  return argv0_local._7_1_;
}

Assistant:

bool SystemTools::FindProgramPath(const char* argv0,
                                  kwsys_stl::string& pathOut,
                                  kwsys_stl::string& errorMsg,
                                  const char* exeName,
                                  const char* buildDir,
                                  const char* installPrefix )
{
  kwsys_stl::vector<kwsys_stl::string> failures;
  kwsys_stl::string self = argv0 ? argv0 : "";
  failures.push_back(self);
  SystemTools::ConvertToUnixSlashes(self);
  self = SystemTools::FindProgram(self);
  if(!SystemTools::FileExists(self))
    {
    if(buildDir)
      {
      kwsys_stl::string intdir = ".";
#ifdef  CMAKE_INTDIR
      intdir = CMAKE_INTDIR;
#endif
      self = buildDir;
      self += "/bin/";
      self += intdir;
      self += "/";
      self += exeName;
      self += SystemTools::GetExecutableExtension();
      }
    }
  if(installPrefix)
    {
    if(!SystemTools::FileExists(self))
      {
      failures.push_back(self);
      self = installPrefix;
      self += "/bin/";
      self +=  exeName;
      }
    }
  if(!SystemTools::FileExists(self))
    {
    failures.push_back(self);
    kwsys_ios::ostringstream msg;
    msg << "Can not find the command line program ";
    if (exeName)
      {
      msg << exeName;
      }
    msg << "\n";
    if (argv0)
      {
      msg << "  argv[0] = \"" << argv0 << "\"\n";
      }
    msg << "  Attempted paths:\n";
    kwsys_stl::vector<kwsys_stl::string>::iterator i;
    for(i=failures.begin(); i != failures.end(); ++i)
      {
      msg << "    \"" << *i << "\"\n";
      }
    errorMsg = msg.str();
    return false;
    }
  pathOut = self;
  return true;
}